

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O1

size_t __thiscall
jrtplib::RTCPCompoundPacketBuilder::SDES::NeededBytesWithExtraItem
          (SDES *this,uint8_t itemdatalength)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  undefined1 *puVar3;
  long lVar4;
  _Self __tmp;
  _List_node_base *p_Var5;
  ulong uVar6;
  long lVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  
  p_Var5 = (this->sdessources).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)&this->sdessources) {
    p_Var1 = (this->sdesit)._M_node;
    if (p_Var5 == p_Var1) {
      puVar9 = (undefined1 *)0x4;
    }
    else {
      puVar3 = (undefined1 *)0x0;
      do {
        puVar8 = puVar3;
        p_Var2 = p_Var5[1]._M_next[3]._M_next;
        puVar3 = (undefined1 *)((long)&p_Var2->_M_next + 1);
        uVar6 = (ulong)((uint)puVar3 & 3);
        puVar9 = (undefined1 *)((long)p_Var2 + (5 - uVar6));
        if (uVar6 == 0) {
          puVar9 = puVar3;
        }
        p_Var5 = p_Var5->_M_next;
        puVar3 = puVar9 + (long)(puVar8 + 4);
      } while (p_Var5 != p_Var1);
      puVar9 = puVar9 + (long)(puVar8 + 8);
    }
    p_Var5 = p_Var1[1]._M_next[3]._M_next;
    lVar4 = (long)&p_Var5->_M_next + (ulong)itemdatalength + 3;
    uVar6 = (ulong)((uint)lVar4 & 3);
    lVar7 = (long)p_Var5 + (itemdatalength - uVar6) + 7;
    if (uVar6 == 0) {
      lVar7 = lVar4;
    }
    uVar6 = (this->sdessources).
            super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ._M_impl._M_node._M_size;
    return (size_t)(puVar9 + ((ulong)(0x842108421084210 < uVar6 * -0x1084210842108421) +
                             uVar6 / 0x1f) * 4 + lVar7);
  }
  return 0;
}

Assistant:

size_t NeededBytesWithExtraItem(uint8_t itemdatalength)
		{
			std::list<SDESSource *>::const_iterator it;
			size_t x = 0;
			size_t n,d,r;
			
			if (sdessources.empty())
				return 0;
			
			for (it = sdessources.begin() ; it != sdesit ; it++)
				x += (*it)->NeededBytes();
			x += (*sdesit)->NeededBytesWithExtraItem(itemdatalength);
			n = sdessources.size();
			d = n/31;
			r = n%31;
			if (r != 0)
				d++;
			x += d*sizeof(RTCPCommonHeader);
			return x;
		}